

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::Room(Room *this,string *long_desc,string *short_desc,int *directions)

{
  int local_38;
  int i;
  int *directions_local;
  string *short_desc_local;
  string *long_desc_local;
  Room *this_local;
  
  std::__cxx11::string::string((string *)&this->m_long_description);
  std::__cxx11::string::string((string *)&this->m_short_description);
  std::
  map<int,_std::shared_ptr<Player>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Player>_>_>_>
  ::map(&this->m_player_map);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<NPC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<NPC>_>_>_>
  ::map(&this->m_npc_map);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_ship_ids);
  std::
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::map(&this->m_ships);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_items);
  this->m_id = 0;
  std::__cxx11::string::operator=((string *)&this->m_long_description,(string *)long_desc);
  std::__cxx11::string::operator=((string *)&this->m_short_description,(string *)short_desc);
  for (local_38 = 0; local_38 < 10; local_38 = local_38 + 1) {
    this->m_directions[local_38] = directions[local_38];
  }
  this->m_landing_level = NONE;
  this->m_is_cockpit = false;
  return;
}

Assistant:

Room::Room(const std::string &long_desc, const std::string &short_desc, const int *directions) {
    m_id = 0;
    m_long_description = long_desc;
    m_short_description = short_desc;
    for(int i = 0; i < NUMBER_OF_DIRECTIONS; ++i) {
        m_directions[i] = directions[i];
    }
    m_landing_level = NONE;
    m_is_cockpit = false;
}